

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_inc(BtorSimBitVector *bv)

{
  BtorSimBitVector *__ptr;
  BtorSimBitVector *pBVar1;
  BtorSimBitVector *one;
  BtorSimBitVector *res;
  BtorSimBitVector *in_stack_00000018;
  BtorSimBitVector *in_stack_00000020;
  undefined8 in_stack_fffffffffffffff0;
  
  __ptr = btorsim_bv_one((uint32_t)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  pBVar1 = btorsim_bv_add(in_stack_00000020,in_stack_00000018);
  free(__ptr);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_inc (const BtorSimBitVector *bv)
{
  assert (bv);

  BtorSimBitVector *res, *one;

  one = btorsim_bv_one (bv->width);
  res = btorsim_bv_add (bv, one);
  free (one);
  return res;
}